

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::TextureViewTestViewClasses::iterate(TextureViewTestViewClasses *this)

{
  GLenum texture_internalformat;
  GLenum view_internalformat;
  uint uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  _Alloc_hider _Var6;
  uchar *texture_data_ptr;
  NotSupportedError *this_00;
  char *description;
  _compatible_internalformat_pairs internalformat_combinations;
  string local_58;
  GLenum *local_38;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_texture_view");
  if (!bVar2) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"GL_ARB_texture_view is not supported, skipping.","");
    tcu::NotSupportedError::NotSupportedError(this_00,&local_58);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  TextureViewUtilities::getLegalTextureAndViewInternalformatCombinations();
  _Var6._M_p = local_58._M_dataplus._M_p;
  if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
    do {
      texture_internalformat = *(GLenum *)_Var6._M_p;
      view_internalformat = *(GLenum *)((long)_Var6._M_p + 4);
      local_38 = (GLenum *)_Var6._M_p;
      initTextureObject(this,true,texture_internalformat,view_internalformat);
      initTextureObject(this,false,texture_internalformat,view_internalformat);
      initBufferObject(this,texture_internalformat,view_internalformat);
      initProgramObject(this,texture_internalformat,view_internalformat);
      (**(code **)(lVar5 + 8))(this->m_texture_unit_for_parent_texture);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glActiveTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1ce8);
      (**(code **)(lVar5 + 0xb8))(0xde1,this->m_to_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1ceb);
      (**(code **)(lVar5 + 8))(this->m_texture_unit_for_view_texture);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glActiveTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1cee);
      (**(code **)(lVar5 + 0xb8))(0xde1,this->m_view_to_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1cf1);
      (**(code **)(lVar5 + 0x30))(0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBeginTransformFeedback() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1cf5);
      (**(code **)(lVar5 + 0x538))(0,0,this->m_texture_height * this->m_texture_width);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glDrawArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1cf8);
      (**(code **)(lVar5 + 0x638))();
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glEndTransformFeedback() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1cfb);
      texture_data_ptr = (uchar *)(**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
      uVar1 = this->m_view_data_offset;
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glMapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d03);
      verifyResultData(this,texture_internalformat,view_internalformat,texture_data_ptr,
                       texture_data_ptr + uVar1);
      (**(code **)(lVar5 + 0x1670))(0x8c8e);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1d0a);
      _Var6._M_p = (pointer)(local_38 + 2);
    } while (local_38 + 2 != (GLenum *)local_58._M_string_length);
  }
  description = "Pass";
  if (this->m_has_test_failed != false) {
    description = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)this->m_has_test_failed,description);
  if ((GLenum *)local_58._M_dataplus._M_p != (GLenum *)0x0) {
    operator_delete(local_58._M_dataplus._M_p,
                    local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureViewTestViewClasses::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Only execute the test if GL_ARB_texture_view is supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_view"))
	{
		throw tcu::NotSupportedError("GL_ARB_texture_view is not supported, skipping.");
	}

	/* Create all GL objects required to run the test */
	initTest();

	/* Iterate through all valid "texture internalformat + view internalformat" combinations */
	TextureViewUtilities::_compatible_internalformat_pairs_const_iterator internalformat_combination_iterator;
	TextureViewUtilities::_compatible_internalformat_pairs				  internalformat_combinations =
		TextureViewUtilities::getLegalTextureAndViewInternalformatCombinations();

	for (internalformat_combination_iterator = internalformat_combinations.begin();
		 internalformat_combination_iterator != internalformat_combinations.end();
		 internalformat_combination_iterator++)
	{
		TextureViewUtilities::_internalformat_pair internalformat_pair	= *internalformat_combination_iterator;
		glw::GLenum								   texture_internalformat = internalformat_pair.first;
		glw::GLenum								   view_internalformat	= internalformat_pair.second;

		/* Initialize parent texture object storage */
		initTextureObject(true, /* should_init_parent_texture */
						  texture_internalformat, view_internalformat);

		/* Create the texture view */
		initTextureObject(false, /* should_init_parent_texture */
						  texture_internalformat, view_internalformat);

		/* Initialize buffer object storage so that it's large enough to
		 * hold the result data.
		 **/
		initBufferObject(texture_internalformat, view_internalformat);

		/* Create the program object we'll use for the test */
		initProgramObject(texture_internalformat, view_internalformat);

		/* Configure texture bindings */
		gl.activeTexture(m_texture_unit_for_parent_texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

		gl.bindTexture(GL_TEXTURE_2D, m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.activeTexture(m_texture_unit_for_view_texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

		gl.bindTexture(GL_TEXTURE_2D, m_view_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		/* Run the test program */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, m_texture_width * m_texture_height);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

		/* Retrieve the results */
		const unsigned char* result_bo_data_ptr =
			(const unsigned char*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		const unsigned char* result_texture_data_ptr = result_bo_data_ptr;
		const unsigned char* result_view_data_ptr	= result_bo_data_ptr + m_view_data_offset;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

		/* Verify the retrieved values are valid */
		verifyResultData(texture_internalformat, view_internalformat, result_texture_data_ptr, result_view_data_ptr);

		/* Unmap the buffer object */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
	} /* for (all internalformat combinations) */

	if (m_has_test_failed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}